

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

string * __thiscall
glu::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  ostringstream oVar1;
  byte bVar2;
  string *psVar3;
  char cVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ostringstream *poVar9;
  int iVar10;
  char *pcVar11;
  ostringstream o;
  byte local_349;
  long *local_348;
  uint local_340;
  long local_338 [2];
  string *local_328;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (pcVar11 = str + 3; cVar4 = pcVar11[-1], cVar4 == ' '; pcVar11 = pcVar11 + 1) {
  }
  if (cVar4 == '\r') {
    cVar4 = *pcVar11;
  }
  else {
    pcVar11 = pcVar11 + -1;
  }
  poVar9 = (ostringstream *)(pcVar11 + (cVar4 == '\n'));
  while( true ) {
    for (; oVar1 = *poVar9, oVar1 == (ostringstream)0x5c; poVar9 = poVar9 + 2) {
      oVar1 = poVar9[1];
      if (oVar1 != (ostringstream)0x0) {
        if (oVar1 == (ostringstream)0x74) {
          local_320[0] = (ostringstream)0x9;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_320,1);
        }
        else if (oVar1 == (ostringstream)0x6e) {
          local_320[0] = (ostringstream)0xa;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_320,1);
        }
        else {
          local_320[0] = oVar1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_320,1);
        }
      }
    }
    if ((oVar1 == (ostringstream)0x22) && (poVar9[1] == (ostringstream)0x22)) break;
    local_320[0] = oVar1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)local_320,1);
    poVar9 = poVar9 + 1;
  }
  std::__cxx11::stringbuf::str();
  if ((int)local_340 < 1) {
    iVar8 = 0;
  }
  else {
    uVar6 = 0;
    iVar8 = 0;
    do {
      bVar2 = *(byte *)((long)local_348 + uVar6);
      if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
      iVar8 = iVar8 + (uint)(bVar2 == 9) * 3 + 1;
      uVar6 = uVar6 + 1;
    } while ((local_340 & 0x7fffffff) != uVar6);
  }
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_320);
  if (0 < (int)local_340) {
    bVar5 = true;
    iVar7 = 0;
    iVar10 = 0;
    do {
      bVar2 = *(byte *)((long)local_348 + (long)iVar7);
      if ((bVar5) && (iVar10 < iVar8)) {
        if (bVar2 < 0xd) {
          if (bVar2 == 9) {
LAB_00a33fef:
            iVar10 = iVar10 + (uint)(bVar2 == 9) * 3 + 1;
            goto LAB_00a34041;
          }
          if (bVar2 == 10) goto LAB_00a3402a;
        }
        else {
          if (bVar2 == 0xd) goto LAB_00a34002;
          if (bVar2 == 0x20) goto LAB_00a33fef;
        }
LAB_00a34045:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        bVar5 = false;
      }
      else if (bVar2 == 10) {
LAB_00a3402a:
        local_349 = bVar2;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar10 = 0;
LAB_00a34041:
        bVar5 = true;
      }
      else {
        if (bVar2 != 0xd) goto LAB_00a34045;
LAB_00a34002:
        if (*(char *)((long)local_348 + (long)iVar7 + 1) != '\n') goto LAB_00a3402a;
        local_349 = 10;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_320,(char *)&local_349,1);
        iVar7 = iVar7 + 1;
        iVar10 = 0;
        bVar5 = true;
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (int)local_340);
  }
  psVar3 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

string ShaderParser::parseShaderSource (const char* str)
{
	const char*		p = str+2;
	ostringstream	o;

	// Eat first empty line from beginning.
	while (*p == ' ') p++;
	if (*p == '\r') p++;
	if (*p == '\n') p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
				case 0:		DE_ASSERT(DE_FALSE);	break;
				case 'n':	o << '\n';				break;
				case 't':	o << '\t';				break;
				default:	o << p[1];				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}